

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O1

void __thiscall kj::Exception::Exception(Exception *this,Exception *other)

{
  size_t sVar1;
  ArrayDisposer *pAVar2;
  Context *pCVar3;
  Disposer *pDVar4;
  Context *this_00;
  char *pcVar5;
  size_t size;
  char *pcVar6;
  char *pcVar7;
  String local_38;
  
  (this->ownFile).content.ptr = (char *)0x0;
  (this->ownFile).content.size_ = 0;
  (this->ownFile).content.disposer = (ArrayDisposer *)0x0;
  this->file = other->file;
  this->line = other->line;
  this->type = other->type;
  pcVar6 = (char *)(other->description).content.size_;
  pcVar7 = pcVar6;
  if (pcVar6 != (char *)0x0) {
    pcVar7 = (other->description).content.ptr;
  }
  pcVar5 = pcVar6 + -1;
  if (pcVar6 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  heapString(&this->description,pcVar7,(size_t)pcVar5);
  (this->context).ptr.disposer = (Disposer *)0x0;
  (this->context).ptr.ptr = (Context *)0x0;
  this->traceCount = other->traceCount;
  pcVar6 = (other->ownFile).content.ptr;
  sVar1 = (other->ownFile).content.size_;
  pcVar7 = "";
  pcVar5 = pcVar6;
  if (sVar1 == 0) {
    pcVar5 = "";
  }
  if (this->file == pcVar5) {
    if (sVar1 == 0) {
      pcVar6 = (char *)0x0;
    }
    size = 0;
    if (sVar1 != 0) {
      size = sVar1 - 1;
    }
    heapString(&local_38,pcVar6,size);
    pcVar6 = (this->ownFile).content.ptr;
    if (pcVar6 != (char *)0x0) {
      sVar1 = (this->ownFile).content.size_;
      pAVar2 = (this->ownFile).content.disposer;
      (this->ownFile).content.ptr = (char *)0x0;
      (this->ownFile).content.size_ = 0;
      (**pAVar2->_vptr_ArrayDisposer)(pAVar2,pcVar6,1,sVar1,sVar1,0);
    }
    (this->ownFile).content.ptr = local_38.content.ptr;
    (this->ownFile).content.size_ = local_38.content.size_;
    (this->ownFile).content.disposer = local_38.content.disposer;
    if ((this->ownFile).content.size_ != 0) {
      pcVar7 = (this->ownFile).content.ptr;
    }
    this->file = pcVar7;
  }
  memcpy(this->trace,other->trace,(ulong)this->traceCount << 3);
  if ((other->context).ptr.ptr != (Context *)0x0) {
    pCVar3 = (other->context).ptr.ptr;
    this_00 = (Context *)operator_new(0x38);
    Context::Context(this_00,pCVar3);
    pDVar4 = (this->context).ptr.disposer;
    pCVar3 = (this->context).ptr.ptr;
    (this->context).ptr.disposer = (Disposer *)&_::HeapDisposer<kj::Exception::Context>::instance;
    (this->context).ptr.ptr = this_00;
    if (pCVar3 != (Context *)0x0) {
      (**pDVar4->_vptr_Disposer)();
    }
  }
  return;
}

Assistant:

Exception::Exception(const Exception& other) noexcept
    : file(other.file), line(other.line), type(other.type),
      description(heapString(other.description)), traceCount(other.traceCount) {
  if (file == other.ownFile.cStr()) {
    ownFile = heapString(other.ownFile);
    file = ownFile.cStr();
  }

  memcpy(trace, other.trace, sizeof(trace[0]) * traceCount);

  KJ_IF_MAYBE(c, other.context) {
    context = heap(**c);
  }
}